

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
build_ir_constructor(Context_conflict *ctx,MOJOSHADER_astExpressionConstructor *ast)

{
  int iVar1;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_irExprList *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_astDataTypeType MVar5;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar2 = reduce_datatype(ctx,dt);
  MVar5 = pMVar2->type;
  if (MVar5 - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
    MVar5 = ((pMVar2->array).base)->type;
  }
  iVar1 = datatype_elems(ctx,dt);
  if (iVar1 < 0x11) {
    pMVar3 = build_ir_exprlist(ctx,ast->args);
    pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      (pMVar4->ir).type = MOJOSHADER_IR_CONSTRUCT;
      (pMVar4->ir).filename = ctx->sourcefile;
      (pMVar4->ir).line = ctx->sourceline;
      (pMVar4->info).type = MVar5;
      (pMVar4->info).elements = iVar1;
      (pMVar4->construct).args = pMVar3;
    }
    return pMVar4;
  }
  __assert_fail("elems <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1498,
                "MOJOSHADER_irExpression *build_ir_constructor(Context *, const MOJOSHADER_astExpressionConstructor *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_constructor(Context *ctx, const MOJOSHADER_astExpressionConstructor *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    assert(elems <= 16);  // just in case (matrix4x4 constructor is largest).
    return new_ir_construct(ctx, build_ir_exprlist(ctx, ast->args), type, elems);
}